

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token * __thiscall Lexer::readToken(Token *__return_storage_ptr__,Lexer *this)

{
  byte __rhs;
  int iVar1;
  undefined8 extraout_RAX;
  uint uVar2;
  Token token;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  skipWhitespace(this);
  __return_storage_ptr__->type = NullToken;
  __return_storage_ptr__->lineNumber = 0;
  __return_storage_ptr__->columnNumber = 0;
  (__return_storage_ptr__->tokenData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->tokenData).field_2;
  (__return_storage_ptr__->tokenData)._M_string_length = 0;
  (__return_storage_ptr__->tokenData).field_2._M_local_buf[0] = '\0';
  local_98._0_4_ = this->_currentLineNo;
  local_98._4_4_ = this->_currentColumnNo;
  uStack_90 = 0;
  __rhs = peekChar(this);
  iVar1 = isalpha((int)(char)__rhs);
  if (((iVar1 == 0) && (__rhs != 0x5f)) && (__rhs != 0x2e)) {
    if (__rhs == 0x2d || (int)(char)__rhs - 0x30U < 10) {
      readNumber((Token *)local_c8,this);
    }
    else {
      uVar2 = __rhs - 0x23;
      if (0x1d < uVar2) {
LAB_00109c3a:
        if (__rhs != 0) {
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          local_80._M_string_length = 0;
          local_80.field_2._M_local_buf[0] = '\0';
          std::operator+(&local_60,&local_80,"unexpected character: \'");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8,&local_60,__rhs);
          std::operator+(&local_40,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8,"\'");
          lexerError(this,&local_40);
          std::__cxx11::string::~string((string *)&local_40);
          std::__cxx11::string::~string((string *)local_c8);
          std::__cxx11::string::~string((string *)&local_60);
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&__return_storage_ptr__->tokenData);
          _Unwind_Resume(extraout_RAX);
        }
        local_c8._0_8_ = (pointer)0x6;
        local_c8._8_4_ = 0;
        local_b8._M_allocated_capacity = (size_type)&local_a8;
        local_b8._8_8_ = 0;
        local_a8._M_local_buf[0] = '\0';
        Token::operator=(__return_storage_ptr__,(Token *)local_c8);
        goto LAB_00109ba1;
      }
      if ((0x800261U >> (uVar2 & 0x1f) & 1) == 0) {
        if (uVar2 != 0x1d) goto LAB_00109c3a;
        readRegister((Token *)local_c8,this);
      }
      else {
        readDelimiter((Token *)local_c8,this);
      }
    }
  }
  else {
    readKeywordOrIdentifier((Token *)local_c8,this);
  }
  Token::operator=(__return_storage_ptr__,(Token *)local_c8);
LAB_00109ba1:
  std::__cxx11::string::~string((string *)(local_c8 + 0x10));
  __return_storage_ptr__->lineNumber = (int)local_98 + 1;
  __return_storage_ptr__->columnNumber = local_98._4_4_ + 1;
  skipWhitespace(this);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::readToken() {
    skipWhitespace();

    Token token{Token::NullToken};

    int lineNo = _currentLineNo + 1;
    int colNo = _currentColumnNo + 1;

    char c = peekChar();

    if(std::isalpha(c) || c == '.' || c == '_') {
        token = readKeywordOrIdentifier();
    } else if(std::isdigit(c) || c == '-') {
        token = readNumber();
    } else {
        switch(c) {
//            case '.':
//                token = readKeyword();
//                break;
            case '@':
                token = readRegister();
                break;
            case '\0':
                token = readLineTerminator();
                break;
            case ',':
            case '(':
            case ')':
            case ':':
            case '#':
                token = readDelimiter();
                break;
            default:
                lexerError(std::string{} + "unexpected character: '" + c + "'");
        }
    }

    token.lineNumber = lineNo;
    token.columnNumber = colNo;

    skipWhitespace();

    return token;
}